

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

int float128_compare_internal(float128 a,float128 b,int is_quiet,float_status *status)

{
  byte bVar1;
  byte bVar2;
  int32_t iVar3;
  int iVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  ulong b0;
  uint64_t b1;
  ulong a0;
  uint64_t a1;
  flag bSign;
  flag aSign;
  float_status *status_local;
  int is_quiet_local;
  float128 b_local;
  float128 a_local;
  
  b0 = b.high;
  b1 = b.low;
  a0 = a.high;
  a1 = a.low;
  iVar3 = extractFloat128Exp(a);
  if (iVar3 == 0x7fff) {
    uVar5 = extractFloat128Frac0(a);
    uVar6 = extractFloat128Frac1(a);
    if (uVar5 != 0 || uVar6 != 0) goto LAB_012cd724;
  }
  iVar3 = extractFloat128Exp(b);
  if (iVar3 == 0x7fff) {
    uVar5 = extractFloat128Frac0(b);
    uVar6 = extractFloat128Frac1(b);
    if (uVar5 != 0 || uVar6 != 0) {
LAB_012cd724:
      if (((is_quiet == 0) || (iVar4 = float128_is_signaling_nan_tricore(a,status), iVar4 != 0)) ||
         (iVar4 = float128_is_signaling_nan_tricore(b,status), iVar4 != 0)) {
        float_raise_tricore('\x01',status);
      }
      return 2;
    }
  }
  bVar1 = extractFloat128Sign(a);
  bVar2 = extractFloat128Sign(b);
  if (bVar1 != bVar2) {
    if ((((a0 | b0) & 0x7fffffffffffffff) == 0 && a1 == 0) && b1 == 0) {
      return 0;
    }
    return (uint)bVar1 * -2 + 1;
  }
  if ((a1 == b1) && (a0 == b0)) {
    return 0;
  }
  bVar2 = lt128(a0,a1,b0,b1);
  return (uint)(bVar1 ^ bVar2) * -2 + 1;
}

Assistant:

static inline int float128_compare_internal(float128 a, float128 b,
                                            int is_quiet, float_status *status)
{
    flag aSign, bSign;

    if (( ( extractFloat128Exp( a ) == 0x7fff ) &&
          ( extractFloat128Frac0( a ) | extractFloat128Frac1( a ) ) ) ||
        ( ( extractFloat128Exp( b ) == 0x7fff ) &&
          ( extractFloat128Frac0( b ) | extractFloat128Frac1( b ) ) )) {
        if (!is_quiet ||
            float128_is_signaling_nan(a, status) ||
            float128_is_signaling_nan(b, status)) {
            float_raise(float_flag_invalid, status);
        }
        return float_relation_unordered;
    }
    aSign = extractFloat128Sign( a );
    bSign = extractFloat128Sign( b );
    if ( aSign != bSign ) {
        if ( ( ( ( a.high | b.high )<<1 ) | a.low | b.low ) == 0 ) {
            /* zero case */
            return float_relation_equal;
        } else {
            return 1 - (2 * aSign);
        }
    } else {
        if (a.low == b.low && a.high == b.high) {
            return float_relation_equal;
        } else {
            return 1 - 2 * (aSign ^ ( lt128( a.high, a.low, b.high, b.low ) ));
        }
    }
}